

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsondocument.cpp
# Opt level: O0

QJsonValue * __thiscall QJsonDocument::operator[](QJsonDocument *this,qsizetype i)

{
  bool bVar1;
  QCborArray *in_RSI;
  QCborValue *in_RDI;
  long in_FS_OFFSET;
  QJsonDocument *in_stack_ffffffffffffff88;
  QCborValue *this_00;
  QCborValue *i_00;
  Type in_stack_ffffffffffffffb4;
  QCborValue *in_stack_ffffffffffffffb8;
  QCborValue local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  i_00 = in_RDI;
  bVar1 = isArray(in_stack_ffffffffffffff88);
  if (bVar1) {
    std::unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>::operator->
              ((unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_> *)
               0x48f473);
    this_00 = &local_28;
    ::QCborValue::toArray(in_stack_ffffffffffffffb8);
    QCborArray::at(in_RSI,(qsizetype)i_00);
    QJsonPrivate::Value::fromTrustedCbor(in_RDI);
    ::QCborValue::~QCborValue(this_00);
    QCborArray::~QCborArray((QCborArray *)0x48f4c0);
  }
  else {
    QJsonValue::QJsonValue((QJsonValue *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QJsonValue *)i_00;
  }
  __stack_chk_fail();
}

Assistant:

const QJsonValue QJsonDocument::operator[](qsizetype i) const
{
    if (!isArray())
        return QJsonValue(QJsonValue::Undefined);

    return QJsonPrivate::Value::fromTrustedCbor(d->value.toArray().at(i));
}